

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O0

CURLcode tftp_done(connectdata *conn,CURLcode status,_Bool premature)

{
  tftp_state_data *ptVar1;
  int iVar2;
  tftp_state_data_t *state;
  CURLcode result;
  _Bool premature_local;
  CURLcode status_local;
  connectdata *conn_local;
  
  state._4_4_ = CURLE_OK;
  ptVar1 = (conn->proto).tftpc;
  iVar2 = Curl_pgrsDone(conn);
  if (iVar2 == 0) {
    if (ptVar1 != (tftp_state_data *)0x0) {
      state._4_4_ = tftp_translate_code(ptVar1->error);
    }
    conn_local._4_4_ = state._4_4_;
  }
  else {
    conn_local._4_4_ = CURLE_ABORTED_BY_CALLBACK;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode tftp_done(struct connectdata *conn, CURLcode status,
                          bool premature)
{
  CURLcode result = CURLE_OK;
  tftp_state_data_t *state = (tftp_state_data_t *)conn->proto.tftpc;

  (void)status; /* unused */
  (void)premature; /* not used */

  if(Curl_pgrsDone(conn))
    return CURLE_ABORTED_BY_CALLBACK;

  /* If we have encountered an error */
  if(state)
    result = tftp_translate_code(state->error);

  return result;
}